

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  int path_component;
  ulong uVar4;
  Token *pTVar5;
  string *psVar6;
  pointer this_00;
  uint32_t *puVar7;
  Arena *pAVar8;
  char *pcVar9;
  string_view name;
  string_view name_00;
  string_view local_2f0;
  ErrorMaker local_2e0;
  string_view local_2d0;
  ErrorMaker local_2c0;
  undefined1 local_2b0 [8];
  LocationRecorder location_4;
  LocationRecorder location_3;
  DescriptorProto *group;
  LocationRecorder group_location;
  int32_t local_24c;
  undefined1 local_248 [4];
  int number;
  LocationRecorder location_2;
  string_view local_220;
  FieldDescriptorProto *local_210;
  ErrorMaker local_208;
  undefined1 local_1f8 [16];
  FieldDescriptorProto *local_1e8;
  ErrorMaker local_1e0;
  undefined1 local_1d0 [16];
  ErrorMaker local_1c0;
  undefined1 local_1b0 [8];
  LocationRecorder location_1;
  Token name_token;
  string_view local_148;
  string_view local_138;
  undefined1 local_128 [8];
  string type_name;
  Type type;
  bool type_parsed;
  undefined1 local_f0 [8];
  LocationRecorder location;
  MapField map_field;
  LocationRecorder *field_location_local;
  int location_field_number_for_nested_type_local;
  LocationRecorder *parent_location_local;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  MapField::MapField((MapField *)&location.location_);
  LocationRecorder::LocationRecorder((LocationRecorder *)local_f0,field_location);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_f0,&field->super_Message,TYPE);
  bVar2 = false;
  type_name.field_2._12_4_ = 5;
  std::__cxx11::string::string((string *)local_128);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"map");
  bVar1 = TryConsume(this,local_138);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"<");
    bVar1 = LookingAt(this,local_148);
    if (!bVar1) {
      bVar2 = true;
      std::__cxx11::string::operator=((string *)local_128,"map");
      goto LAB_0020380d;
    }
    location.location_._0_1_ = 1;
    bVar1 = ParseMapType(this,(MapField *)&location.location_,field,(LocationRecorder *)local_f0);
    if (bVar1) goto LAB_0020380d;
    this_local._7_1_ = 0;
    bVar2 = true;
  }
  else {
LAB_0020380d:
    if (((byte)location.location_ & 1) == 0) {
      bVar1 = FieldDescriptorProto::has_label(field);
      if ((!bVar1) && (bVar1 = DefaultToOptionalFields(this), bVar1)) {
        FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
      }
      bVar1 = FieldDescriptorProto::has_label(field);
      if (!bVar1) {
        ErrorMaker::ErrorMaker
                  ((ErrorMaker *)&name_token.end_column,
                   "Expected \"required\", \"optional\", or \"repeated\".");
        RecordError(this,stack0xfffffffffffffea0);
        FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
      }
      if ((!bVar2) &&
         (bVar2 = ParseType(this,(Type *)(type_name.field_2._M_local_buf + 0xc),(string *)local_128)
         , !bVar2)) {
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_002039f3;
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        LocationRecorder::AddPath((LocationRecorder *)local_f0,6);
        puVar7 = internal::HasBits<1>::operator[](&(field->field_0)._impl_._has_bits_,0);
        *(byte *)puVar7 = (byte)*puVar7 | 4;
        pAVar8 = MessageLite::GetArena((MessageLite *)field);
        internal::ArenaStringPtr::Set<>
                  (&(field->field_0)._impl_.type_name_,(string *)local_128,pAVar8);
      }
      else {
        LocationRecorder::AddPath((LocationRecorder *)local_f0,5);
        FieldDescriptorProto::set_type(field,type_name.field_2._12_4_);
      }
    }
    bVar2 = false;
  }
LAB_002039f3:
  std::__cxx11::string::~string((string *)local_128);
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_f0);
  if (bVar2) goto LAB_002043ad;
  pTVar5 = io::Tokenizer::current(this->input_);
  io::Tokenizer::Token::Token((Token *)&location_1.location_,pTVar5);
  LocationRecorder::LocationRecorder((LocationRecorder *)local_1b0,field_location,1);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_1b0,&field->super_Message,NAME);
  psVar6 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
  ErrorMaker::ErrorMaker(&local_1c0,"Expected field name.");
  bVar2 = ConsumeIdentifier(this,psVar6,local_1c0);
  if (bVar2) {
    psVar6 = FieldDescriptorProto::name_abi_cxx11_(field);
    local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    name._M_str = local_1d0._8_8_;
    name._M_len = (size_t)name._M_str;
    bVar2 = anon_unknown_0::IsLowerUnderscore(local_1d0._0_8_,name);
    if (!bVar2) {
      local_1e8 = field;
      ErrorMaker::
      ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::__0,void>
                (&local_1e0,(anon_class_8_1_a7e8901a)field);
      RecordWarning(this,local_1e0);
    }
    psVar6 = FieldDescriptorProto::name_abi_cxx11_(field);
    local_1f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    name_00._M_str = local_1f8._8_8_;
    name_00._M_len = (size_t)name_00._M_str;
    bVar2 = anon_unknown_0::IsNumberFollowUnderscore(local_1f8._0_8_,name_00);
    if (bVar2) {
      local_210 = field;
      ErrorMaker::
      ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::__1,void>
                (&local_208,(anon_class_8_1_a7e8901a)field);
      RecordWarning(this,local_208);
    }
    bVar2 = false;
  }
  else {
    this_local._7_1_ = 0;
    bVar2 = true;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_1b0);
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_220,"=");
    ErrorMaker::ErrorMaker((ErrorMaker *)&location_2.location_,"Missing field number.");
    bVar2 = Consume(this,local_220,stack0xfffffffffffffdd0);
    if (bVar2) {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_248,field_location,3);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)local_248,&field->super_Message,NUMBER);
      ErrorMaker::ErrorMaker((ErrorMaker *)&group_location.location_,"Expected field number.");
      bVar2 = ConsumeInteger(this,&local_24c,stack0xfffffffffffffda0);
      if (bVar2) {
        FieldDescriptorProto::set_number(field,local_24c);
      }
      else {
        this_local._7_1_ = 0;
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_248);
      if (bVar2) {
        bVar2 = ParseFieldOptions(this,field,field_location,containing_file);
        if (bVar2) {
          bVar2 = FieldDescriptorProto::has_type(field);
          if (bVar2) {
            FVar3 = FieldDescriptorProto::type(field);
            if (FVar3 != FieldDescriptorProto_Type_TYPE_GROUP) goto LAB_00204302;
            LocationRecorder::LocationRecorder((LocationRecorder *)&group,parent_location);
            LocationRecorder::StartAt((LocationRecorder *)&group,field_location);
            LocationRecorder::AddPath
                      ((LocationRecorder *)&group,location_field_number_for_nested_type);
            path_component = RepeatedPtrField<google::protobuf::DescriptorProto>::size(messages);
            LocationRecorder::AddPath((LocationRecorder *)&group,path_component);
            this_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(messages);
            psVar6 = FieldDescriptorProto::name_abi_cxx11_(field);
            puVar7 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
            *(byte *)puVar7 = (byte)*puVar7 | 1;
            pAVar8 = MessageLite::GetArena((MessageLite *)this_00);
            internal::ArenaStringPtr::Set<>(&(this_00->field_0)._impl_.name_,psVar6,pAVar8);
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)&location_4.location_,(LocationRecorder *)&group,1);
            LocationRecorder::StartAt
                      ((LocationRecorder *)&location_4.location_,(Token *)&location_1.location_);
            LocationRecorder::EndAt
                      ((LocationRecorder *)&location_4.location_,(Token *)&location_1.location_);
            LocationRecorder::RecordLegacyLocation
                      ((LocationRecorder *)&location_4.location_,&this_00->super_Message,NAME);
            LocationRecorder::~LocationRecorder((LocationRecorder *)&location_4.location_);
            LocationRecorder::LocationRecorder((LocationRecorder *)local_2b0,field_location,6);
            LocationRecorder::StartAt((LocationRecorder *)local_2b0,(Token *)&location_1.location_);
            LocationRecorder::EndAt((LocationRecorder *)local_2b0,(Token *)&location_1.location_);
            LocationRecorder::~LocationRecorder((LocationRecorder *)local_2b0);
            psVar6 = DescriptorProto::name_abi_cxx11_(this_00);
            pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
            if (*pcVar9 < 'A') {
LAB_0020408a:
              ErrorMaker::ErrorMaker(&local_2c0,"Group names must start with a capital letter.");
              RecordError(this,name_token.text.field_2._8_4_,name_token.text.field_2._12_4_,
                          local_2c0);
            }
            else {
              psVar6 = DescriptorProto::name_abi_cxx11_(this_00);
              pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
              if ('Z' < *pcVar9) goto LAB_0020408a;
            }
            psVar6 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
            absl::lts_20240722::AsciiStrToLower((string *)psVar6);
            psVar6 = DescriptorProto::name_abi_cxx11_(this_00);
            puVar7 = internal::HasBits<1>::operator[](&(field->field_0)._impl_._has_bits_,0);
            *(byte *)puVar7 = (byte)*puVar7 | 4;
            pAVar8 = MessageLite::GetArena((MessageLite *)field);
            internal::ArenaStringPtr::Set<>(&(field->field_0)._impl_.type_name_,psVar6,pAVar8);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d0,"{")
            ;
            bVar2 = LookingAt(this,local_2d0);
            if (bVar2) {
              bVar2 = ParseMessageBlock(this,this_00,(LocationRecorder *)&group,containing_file);
              if (bVar2) {
                bVar2 = false;
              }
              else {
                this_local._7_1_ = 0;
                bVar2 = true;
              }
            }
            else {
              ErrorMaker::ErrorMaker(&local_2e0,"Missing group body.");
              RecordError(this,local_2e0);
              this_local._7_1_ = 0;
              bVar2 = true;
            }
            LocationRecorder::~LocationRecorder((LocationRecorder *)&group);
            if (bVar2) goto LAB_00204391;
          }
          else {
LAB_00204302:
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f0,";")
            ;
            bVar2 = ConsumeEndOfDeclaration(this,local_2f0,field_location);
            if (!bVar2) {
              this_local._7_1_ = 0;
              goto LAB_00204391;
            }
          }
          if (((byte)location.location_ & 1) != 0) {
            GenerateMapEntry(this,(MapField *)&location.location_,field,messages);
          }
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_00204391:
  io::Tokenizer::Token::~Token((Token *)&location_1.location_);
LAB_002043ad:
  MapField::~MapField((MapField *)&location.location_);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field, RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    std::string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
        DO(ParseMapType(&map_field, field, location));
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (!map_field.is_map_field) {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        RecordError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named
      // "map", which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));

    if (!IsLowerUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Field name should be lowercase. Found: ", field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
    if (IsNumberFollowUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Number should not come right after an underscore. Found: ",
            field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(field,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(group,
                                    DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      RecordError(name_token.line, name_token.column,
                  "Group names must start with a capital letter.");
    }
    absl::AsciiStrToLower(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      RecordError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}